

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O0

void corrupt(FILE *stream)

{
  int iVar1;
  size_t sVar2;
  FILE *in_RDI;
  size_t i;
  uint8_t v;
  ulong local_18;
  byte local_9;
  FILE *local_8;
  
  local_18 = 0;
  local_8 = in_RDI;
  while( true ) {
    if (7 < local_18) {
      sVar2 = fread(&local_9,1,1,local_8);
      if (sVar2 == 1) {
        printf("...\n");
      }
      else {
        iVar1 = ferror(local_8);
        if (iVar1 != 0) {
          printf("\nget an error...\n");
        }
      }
      return;
    }
    sVar2 = fread(&local_9,1,1,local_8);
    if (sVar2 != 1) break;
    if (local_18 != 0) {
      printf(" ");
    }
    printf("%02hhx",(ulong)local_9);
    local_18 = local_18 + 1;
  }
  iVar1 = ferror(local_8);
  if (iVar1 == 0) {
    return;
  }
  printf("get an error...\n");
  return;
}

Assistant:

void corrupt(FILE* stream)
{
	uint8_t v;
	for (size_t i = 0; i < 8; i++)
	{
		if (fread(&v, 1, 1, stream) != 1)
		{
			if (ferror(stream))
			{
				printf("get an error...\n");
			}
			return;
		}
		if (i != 0)
		{
			printf(" ");
		}
		printf("%02hhx", v);
	}
	if (fread(&v, 1, 1, stream) != 1)
	{
		if (ferror(stream))
		{
			printf("\nget an error...\n");
		}
		return;
	}
	printf("...\n");
}